

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

float * GPU_GetModelView(void)

{
  uint uVar1;
  GPU_Context *pGVar2;
  GPU_Target *pGVar3;
  float *pfVar4;
  
  pGVar3 = GPU_GetContextTarget();
  if (((pGVar3 == (GPU_Target *)0x0) || (pGVar2 = pGVar3->context, pGVar2 == (GPU_Context *)0x0)) ||
     (uVar1 = (pGVar2->modelview_matrix).size, uVar1 == 0)) {
    pfVar4 = (float *)0x0;
  }
  else {
    pfVar4 = (pGVar2->modelview_matrix).matrix[uVar1 - 1];
  }
  return pfVar4;
}

Assistant:

float* GPU_GetModelView(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return NULL;
    stack = &target->context->modelview_matrix;
    if(stack->size == 0)
        return NULL;
    return stack->matrix[stack->size-1];
}